

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

node_t binop(int id,node_t left,node_t right)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  uint uVar4;
  
  piVar2 = (int *)mmalloc(0x48);
  piVar2[4] = 0;
  piVar2[5] = 0;
  piVar2[6] = 0;
  piVar2[7] = 0;
  *piVar2 = id;
  piVar2[1] = (id == 0x3d) + 3 + (uint)(id == 0x3d);
  piVar2[2] = 1;
  pvVar3 = mrealloc((void *)0x0,8);
  *(void **)(piVar2 + 6) = pvVar3;
  iVar1 = piVar2[2];
  *(node_t *)((long)pvVar3 + (ulong)(iVar1 - 1) * 8) = left;
  *(int **)((long)left + 0x10) = piVar2;
  uVar4 = iVar1 + 1;
  piVar2[2] = uVar4;
  pvVar3 = mrealloc(*(void **)(piVar2 + 6),(ulong)uVar4 << 3);
  *(void **)(piVar2 + 6) = pvVar3;
  *(node_t *)((long)pvVar3 + (ulong)(piVar2[2] - 1) * 8) = right;
  *(int **)((long)right + 0x10) = piVar2;
  return piVar2;
}

Assistant:

node_t binop(int id, node_t left, node_t right)
{
    _node_t* new = create_node();
    new->id = id;
    if (id == '=')
        new->type = ASSIGN;
    else
        new->type = BINOP;
    add_child(new, (_node_t*)left);
    add_child(new, (_node_t*)right);
    return (node_t)new;
}